

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

size_t __thiscall
spvtools::opt::analysis::Function::ComputeExtraStateHash(Function *this,size_t hash,SeenTypes *seen)

{
  bool bVar1;
  reference ppTVar2;
  size_t sVar3;
  Type *t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range2;
  SeenTypes *seen_local;
  size_t hash_local;
  Function *this_local;
  
  __end2 = std::
           vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
           ::begin(&this->param_types_);
  t = (Type *)std::
              vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ::end(&this->param_types_);
  seen_local = (SeenTypes *)hash;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                *)&t);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
              ::operator*(&__end2);
    seen_local = (SeenTypes *)analysis::Type::ComputeHashValue(*ppTVar2,(size_t)seen_local,seen);
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
    ::operator++(&__end2);
  }
  sVar3 = analysis::Type::ComputeHashValue(this->return_type_,(size_t)seen_local,seen);
  return sVar3;
}

Assistant:

size_t Function::ComputeExtraStateHash(size_t hash, SeenTypes* seen) const {
  for (const auto* t : param_types_) {
    hash = t->ComputeHashValue(hash, seen);
  }
  return return_type_->ComputeHashValue(hash, seen);
}